

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O3

btScalar __thiscall btRaycastVehicle::rayCast(btRaycastVehicle *this,btWheelInfo *wheel)

{
  btVector3 *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  btRigidBody *pbVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  btScalar bVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  btVehicleRaycasterResult rayResults;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  undefined8 uStack_24;
  
  updateWheelTransformsWS(this,wheel,false);
  bVar11 = btWheelInfo::getSuspensionRestLength(wheel);
  fVar15 = bVar11 + wheel->m_wheelsRadius;
  uVar5 = *(undefined8 *)(wheel->m_raycastInfo).m_hardPointWS.m_floats;
  uVar6 = *(undefined8 *)(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats;
  pbVar1 = &(wheel->m_raycastInfo).m_contactPointWS;
  auVar9._4_4_ = fVar15 * (float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar5 >> 0x20);
  auVar9._0_4_ = fVar15 * (float)uVar6 + (float)uVar5;
  auVar9._8_4_ = (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[2] * fVar15 +
                 (wheel->m_raycastInfo).m_hardPointWS.m_floats[2];
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])(wheel->m_raycastInfo).m_contactPointWS.m_floats = auVar9;
  lVar10 = (**(code **)(*(long *)this->m_vehicleRaycaster + 0x10))
                     (this->m_vehicleRaycaster,&(wheel->m_raycastInfo).m_hardPointWS,pbVar1);
  (wheel->m_raycastInfo).m_groundObject = (void *)0x0;
  if (lVar10 == 0) {
    bVar11 = btWheelInfo::getSuspensionRestLength(wheel);
    (wheel->m_raycastInfo).m_suspensionLength = bVar11;
    wheel->m_suspensionRelativeVelocity = 0.0;
    auVar8._8_4_ = -(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[2];
    auVar8._0_8_ = *(ulong *)(wheel->m_raycastInfo).m_wheelDirectionWS.m_floats ^ 0x8000000080000000
    ;
    auVar8._12_4_ = 0;
    *(undefined1 (*) [16])(wheel->m_raycastInfo).m_contactNormalWS.m_floats = auVar8;
    bVar11 = -1.0;
    bVar12 = 1.0;
  }
  else {
    bVar11 = fVar15 * -1.0;
    *(undefined8 *)(wheel->m_raycastInfo).m_contactNormalWS.m_floats = local_2c;
    *(undefined8 *)((wheel->m_raycastInfo).m_contactNormalWS.m_floats + 2) = uStack_24;
    (wheel->m_raycastInfo).m_isInContact = true;
    btActionInterface::getFixedBody();
    (wheel->m_raycastInfo).m_groundObject = &btActionInterface::getFixedBody::s_fixed;
    (wheel->m_raycastInfo).m_suspensionLength = bVar11 - wheel->m_wheelsRadius;
    bVar12 = btWheelInfo::getSuspensionRestLength(wheel);
    fVar13 = bVar12 - wheel->m_maxSuspensionTravelCm * 0.01;
    bVar12 = btWheelInfo::getSuspensionRestLength(wheel);
    fVar14 = wheel->m_maxSuspensionTravelCm * 0.01 + bVar12;
    fVar15 = (wheel->m_raycastInfo).m_suspensionLength;
    if ((fVar15 < fVar13) || (fVar13 = fVar15, fVar14 < fVar15)) {
      if (fVar13 <= fVar14) {
        fVar14 = fVar13;
      }
      (wheel->m_raycastInfo).m_suspensionLength = fVar14;
    }
    *(undefined8 *)pbVar1->m_floats = local_3c;
    *(undefined8 *)((wheel->m_raycastInfo).m_contactPointWS.m_floats + 2) = uStack_34;
    fVar15 = (wheel->m_raycastInfo).m_contactNormalWS.m_floats[0];
    fVar13 = (wheel->m_raycastInfo).m_contactNormalWS.m_floats[1];
    fVar14 = (wheel->m_raycastInfo).m_contactNormalWS.m_floats[2];
    fVar16 = (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[2] * fVar14 +
             (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[0] * fVar15 +
             (wheel->m_raycastInfo).m_wheelDirectionWS.m_floats[1] * fVar13;
    if (-0.1 <= fVar16) {
      wheel->m_suspensionRelativeVelocity = 0.0;
      bVar12 = 10.0;
    }
    else {
      pbVar7 = this->m_chassisBody;
      fVar18 = (wheel->m_raycastInfo).m_contactPointWS.m_floats[1] -
               (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
      fVar17 = (wheel->m_raycastInfo).m_contactPointWS.m_floats[0] -
               (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
      fVar2 = (pbVar7->m_angularVelocity).m_floats[0];
      fVar3 = (pbVar7->m_angularVelocity).m_floats[1];
      fVar19 = (wheel->m_raycastInfo).m_contactPointWS.m_floats[2] -
               (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      fVar4 = (pbVar7->m_angularVelocity).m_floats[2];
      bVar12 = -1.0 / fVar16;
      wheel->m_suspensionRelativeVelocity =
           (fVar14 * ((fVar2 * fVar18 - fVar17 * fVar3) + (pbVar7->m_linearVelocity).m_floats[2]) +
           fVar15 * ((fVar3 * fVar19 - fVar18 * fVar4) + (pbVar7->m_linearVelocity).m_floats[0]) +
           fVar13 * ((fVar17 * fVar4 - fVar19 * fVar2) + (pbVar7->m_linearVelocity).m_floats[1])) *
           bVar12;
    }
  }
  wheel->m_clippedInvContactDotSuspension = bVar12;
  return bVar11;
}

Assistant:

btScalar btRaycastVehicle::rayCast(btWheelInfo& wheel)
{
	updateWheelTransformsWS( wheel,false);

	
	btScalar depth = -1;
	
	btScalar raylen = wheel.getSuspensionRestLength()+wheel.m_wheelsRadius;

	btVector3 rayvector = wheel.m_raycastInfo.m_wheelDirectionWS * (raylen);
	const btVector3& source = wheel.m_raycastInfo.m_hardPointWS;
	wheel.m_raycastInfo.m_contactPointWS = source + rayvector;
	const btVector3& target = wheel.m_raycastInfo.m_contactPointWS;

	btScalar param = btScalar(0.);
	
	btVehicleRaycaster::btVehicleRaycasterResult	rayResults;

	btAssert(m_vehicleRaycaster);

	void* object = m_vehicleRaycaster->castRay(source,target,rayResults);

	wheel.m_raycastInfo.m_groundObject = 0;

	if (object)
	{
		param = rayResults.m_distFraction;
		depth = raylen * rayResults.m_distFraction;
		wheel.m_raycastInfo.m_contactNormalWS  = rayResults.m_hitNormalInWorld;
		wheel.m_raycastInfo.m_isInContact = true;
		
		wheel.m_raycastInfo.m_groundObject = &getFixedBody();///@todo for driving on dynamic/movable objects!;
		//wheel.m_raycastInfo.m_groundObject = object;


		btScalar hitDistance = param*raylen;
		wheel.m_raycastInfo.m_suspensionLength = hitDistance - wheel.m_wheelsRadius;
		//clamp on max suspension travel

		btScalar  minSuspensionLength = wheel.getSuspensionRestLength() - wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		btScalar maxSuspensionLength = wheel.getSuspensionRestLength()+ wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		if (wheel.m_raycastInfo.m_suspensionLength < minSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = minSuspensionLength;
		}
		if (wheel.m_raycastInfo.m_suspensionLength > maxSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = maxSuspensionLength;
		}

		wheel.m_raycastInfo.m_contactPointWS = rayResults.m_hitPointInWorld;

		btScalar denominator= wheel.m_raycastInfo.m_contactNormalWS.dot( wheel.m_raycastInfo.m_wheelDirectionWS );

		btVector3 chassis_velocity_at_contactPoint;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS-getRigidBody()->getCenterOfMassPosition();

		chassis_velocity_at_contactPoint = getRigidBody()->getVelocityInLocalPoint(relpos);

		btScalar projVel = wheel.m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );

		if ( denominator >= btScalar(-0.1))
		{
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / denominator;
			wheel.m_suspensionRelativeVelocity = projVel * inv;
			wheel.m_clippedInvContactDotSuspension = inv;
		}
			
	} else
	{
		//put wheel info as in rest position
		wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
		wheel.m_suspensionRelativeVelocity = btScalar(0.0);
		wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
		wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}

	return depth;
}